

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpCore.cpp
# Opt level: O2

void __thiscall helics::tcp::TcpCoreSS::TcpCoreSS(TcpCoreSS *this)

{
  NetworkCore<helics::tcp::TcpCommsSS,_(gmlc::networking::InterfaceTypes)0>::NetworkCore
            (&this->super_NetworkCore<helics::tcp::TcpCommsSS,_(gmlc::networking::InterfaceTypes)0>)
  ;
  (this->super_NetworkCore<helics::tcp::TcpCommsSS,_(gmlc::networking::InterfaceTypes)0>).
  super_CommsBroker<helics::tcp::TcpCommsSS,_helics::CommonCore>.super_CommonCore.super_Core.
  _vptr_Core = (_func_int **)&PTR__TcpCoreSS_004dea30;
  (this->super_NetworkCore<helics::tcp::TcpCommsSS,_(gmlc::networking::InterfaceTypes)0>).
  super_CommsBroker<helics::tcp::TcpCommsSS,_helics::CommonCore>.super_CommonCore.super_BrokerBase.
  _vptr_BrokerBase = (_func_int **)&PTR__TcpCoreSS_004dedd8;
  (this->connections).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->connections).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined8 *)
   ((long)&(this->connections).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish + 1) = 0;
  *(undefined8 *)
   ((long)&(this->connections).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage + 1) = 0;
  return;
}

Assistant:

TcpCoreSS::TcpCoreSS() noexcept {}